

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O3

InputFile * __thiscall
Imf_2_5::MultiPartInputFile::getInputPart<Imf_2_5::InputFile>
          (MultiPartInputFile *this,int partNumber)

{
  _Rb_tree_header *p_Var1;
  pthread_mutex_t *__mutex;
  Data *this_00;
  int iVar2;
  _Base_ptr p_Var3;
  InputFile *this_01;
  InputPartData *part;
  mapped_type *ppGVar4;
  _Base_ptr p_Var5;
  int local_3c;
  pair<int,_Imf_2_5::GenericInputFile_*> local_38;
  
  __mutex = (pthread_mutex_t *)this->_data;
  local_3c = partNumber;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  this_00 = this->_data;
  p_Var3 = (this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this_00->_inputFiles)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (partNumber <= (int)p_Var3[1]._M_color) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < partNumber];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= partNumber)) {
      ppGVar4 = std::
                map<int,_Imf_2_5::GenericInputFile_*,_std::less<int>,_std::allocator<std::pair<const_int,_Imf_2_5::GenericInputFile_*>_>_>
                ::operator[](&this_00->_inputFiles,&local_3c);
      this_01 = (InputFile *)*ppGVar4;
      goto LAB_001616bf;
    }
  }
  this_01 = (InputFile *)operator_new(0x10);
  part = Data::getPart(this_00,partNumber);
  InputFile::InputFile(this_01,part);
  local_38.first = partNumber;
  local_38.second = (GenericInputFile *)this_01;
  std::
  _Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
  ::_M_emplace_unique<std::pair<int,Imf_2_5::GenericInputFile*>>
            ((_Rb_tree<int,std::pair<int_const,Imf_2_5::GenericInputFile*>,std::_Select1st<std::pair<int_const,Imf_2_5::GenericInputFile*>>,std::less<int>,std::allocator<std::pair<int_const,Imf_2_5::GenericInputFile*>>>
              *)&this->_data->_inputFiles,&local_38);
LAB_001616bf:
  pthread_mutex_unlock(__mutex);
  return this_01;
}

Assistant:

T*
MultiPartInputFile::getInputPart(int partNumber)
{
    Lock lock(*_data);
            if (_data->_inputFiles.find(partNumber) == _data->_inputFiles.end())
        {
            T* file = new T(_data->getPart(partNumber));
            _data->_inputFiles.insert(std::make_pair(partNumber, (GenericInputFile*) file));
            return file;
        }
        else return (T*) _data->_inputFiles[partNumber];
}